

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddGroup.c
# Opt level: O0

int zddReorderChildren(DdManager *table,MtrNode *treenode,Cudd_ReorderingType method)

{
  uint uVar1;
  int local_30;
  uint initialSize;
  int result;
  int upper;
  int lower;
  Cudd_ReorderingType method_local;
  MtrNode *treenode_local;
  DdManager *table_local;
  
  initialSize = 0xffffffff;
  upper = method;
  _lower = treenode;
  treenode_local = (MtrNode *)table;
  zddFindNodeHiLo(table,treenode,&result,(int *)&initialSize);
  if (initialSize == 0xffffffff) {
    table_local._4_4_ = 1;
  }
  else {
    if (_lower->flags == 4) {
      local_30 = 1;
    }
    else {
      switch(upper) {
      case 2:
      case 3:
        local_30 = cuddZddSwapping((DdManager *)treenode_local,result,initialSize,upper);
        break;
      case 4:
        local_30 = cuddZddSifting((DdManager *)treenode_local,result,initialSize);
        break;
      case 5:
        do {
          uVar1 = *(uint *)&treenode_local[4].younger;
          local_30 = cuddZddSifting((DdManager *)treenode_local,result,initialSize);
          if (uVar1 <= *(uint *)&treenode_local[4].younger) break;
        } while (local_30 != 0);
        break;
      case 6:
        local_30 = cuddZddSymmSifting((DdManager *)treenode_local,result,initialSize);
        break;
      case 7:
        local_30 = cuddZddSymmSiftingConv((DdManager *)treenode_local,result,initialSize);
        break;
      default:
        return 0;
      case 0xe:
        local_30 = zddGroupSifting((DdManager *)treenode_local,result,initialSize);
        break;
      case 0x12:
        local_30 = cuddZddLinearSifting((DdManager *)treenode_local,result,initialSize);
        break;
      case 0x13:
        do {
          uVar1 = *(uint *)&treenode_local[4].younger;
          local_30 = cuddZddLinearSifting((DdManager *)treenode_local,result,initialSize);
          if (uVar1 <= *(uint *)&treenode_local[4].younger) break;
        } while (local_30 != 0);
      }
    }
    zddMergeGroups((DdManager *)treenode_local,_lower,result,initialSize);
    table_local._4_4_ = local_30;
  }
  return table_local._4_4_;
}

Assistant:

static int
zddReorderChildren(
  DdManager * table,
  MtrNode * treenode,
  Cudd_ReorderingType method)
{
    int lower;
    int upper = -1;
    int result;
    unsigned int initialSize;

    zddFindNodeHiLo(table,treenode,&lower,&upper);
    /* If upper == -1 these variables do not exist yet. */
    if (upper == -1)
        return(1);

    if (treenode->flags == MTR_FIXED) {
        result = 1;
    } else {
#ifdef DD_STATS
        (void) fprintf(table->out," ");
#endif
        switch (method) {
        case CUDD_REORDER_RANDOM:
        case CUDD_REORDER_RANDOM_PIVOT:
            result = cuddZddSwapping(table,lower,upper,method);
            break;
        case CUDD_REORDER_SIFT:
            result = cuddZddSifting(table,lower,upper);
            break;
        case CUDD_REORDER_SIFT_CONVERGE:
            do {
                initialSize = table->keysZ;
                result = cuddZddSifting(table,lower,upper);
                if (initialSize <= table->keysZ)
                    break;
#ifdef DD_STATS
                else
                    (void) fprintf(table->out,"\n");
#endif
            } while (result != 0);
            break;
        case CUDD_REORDER_SYMM_SIFT:
            result = cuddZddSymmSifting(table,lower,upper);
            break;
        case CUDD_REORDER_SYMM_SIFT_CONV:
            result = cuddZddSymmSiftingConv(table,lower,upper);
            break;
        case CUDD_REORDER_GROUP_SIFT:
            result = zddGroupSifting(table,lower,upper);
            break;
        case CUDD_REORDER_LINEAR:
            result = cuddZddLinearSifting(table,lower,upper);
            break;
        case CUDD_REORDER_LINEAR_CONVERGE:
            do {
                initialSize = table->keysZ;
                result = cuddZddLinearSifting(table,lower,upper);
                if (initialSize <= table->keysZ)
                    break;
#ifdef DD_STATS
                else
                    (void) fprintf(table->out,"\n");
#endif
            } while (result != 0);
            break;
        default:
            return(0);
        }
    }

    /* Create a single group for all the variables that were sifted,
    ** so that they will be treated as a single block by successive
    ** invocations of zddGroupSifting.
    */
    zddMergeGroups(table,treenode,lower,upper);

#ifdef DD_DEBUG
    if (pr > 0) (void) fprintf(table->out,"zddReorderChildren:");
#endif

    return(result);

}